

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool PrepareArgumentsForFunctionCall
               (ExpressionContext *ctx,SynBase *source,ArrayView<ArgumentData> functionArguments,
               ArrayView<ArgumentData> arguments,SmallArray<CallArgumentData,_16U> *result,
               uint *extraRating,bool prepareValues)

{
  undefined4 uVar1;
  undefined8 uVar2;
  TypeBase *pTVar3;
  SynBase *pSVar4;
  IntrusiveList<ExprBase> values_00;
  SynBase *pSVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ExprPassthrough *pEVar9;
  TypeUnsizedArray *type;
  ArgumentData *pAVar10;
  CallArgumentData *pCVar11;
  TypeUnsizedArray *type_00;
  ExprBase *pEVar12;
  ExprArray *this;
  TypeArray *pTVar13;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  TypeBase *target;
  CallArgumentData *argument_5;
  undefined1 local_198 [4];
  uint i_8;
  ExprBase *local_188;
  ExprBase *local_180;
  TypeArray *local_178;
  TypeArray *arrType;
  ExprBase *value_3;
  undefined1 auStack_160 [4];
  uint i_7;
  IntrusiveList<ExprBase> values;
  ExprBase *value_2;
  TypeBase *varArgType;
  ExprBase *local_130;
  ExprBase *value_1;
  ArgumentData *argument_4;
  undefined1 local_118 [4];
  uint i_6;
  ModuleData **local_108;
  ArgumentData *argument_3;
  uint i_5;
  uint i_4;
  ExprBase *local_f0;
  ExprBase *local_e8;
  ExprBase *value;
  ArgumentData *argument_2;
  undefined1 auStack_d0 [4];
  uint i_3;
  ExprBase *local_c8;
  long local_c0;
  ArgumentData *functionArgument;
  uint k;
  uint targetPos;
  ArgumentData *argument_1;
  undefined1 local_a0 [4];
  uint i_2;
  uint local_90;
  uint local_8c;
  uint i_1;
  uint unnamedCount;
  ModuleData **local_78;
  ArgumentData *argument;
  ExpressionContext *pEStack_68;
  uint i;
  uint local_60;
  ExpressionContext *local_58;
  uint local_50;
  byte local_41;
  SynBase *pSStack_40;
  bool prepareValues_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> arguments_local;
  ArrayView<ArgumentData> functionArguments_local;
  
  ctx_local = (ExpressionContext *)arguments.data;
  arguments_local._8_8_ = functionArguments.data;
  uVar7 = functionArguments.count;
  arguments_local.data._0_4_ = arguments.count;
  local_41 = prepareValues;
  pSStack_40 = source;
  source_local = (SynBase *)ctx;
  SmallArray<CallArgumentData,_16U>::clear(result);
  local_58 = ctx_local;
  local_50 = (uint)arguments_local.data;
  arguments_01.count = (uint)arguments_local.data;
  arguments_01.data = (ArgumentData *)ctx_local;
  arguments_01._12_4_ = 0;
  bVar6 = HasNamedCallArguments(arguments_01);
  if (bVar6) {
    pEStack_68 = ctx_local;
    local_60 = (uint)arguments_local.data;
    arguments_00.count = (uint)arguments_local.data;
    arguments_00.data = (ArgumentData *)ctx_local;
    arguments_00._12_4_ = 0;
    bVar6 = HasMatchingArgumentNames((ArrayView<ArgumentData> *)&arguments_local.count,arguments_00)
    ;
    if (!bVar6) {
      return false;
    }
    argument._4_4_ = 0;
    while ((argument._4_4_ < (uint)arguments_local.data &&
           (local_78 = (ctx_local->uniqueDependencies).little + (ulong)argument._4_4_ * 6 + -6,
           local_78[2] == (ModuleData *)0x0))) {
      CallArgumentData::CallArgumentData
                ((CallArgumentData *)&i_1,(TypeBase *)local_78[3],(ExprBase *)local_78[4]);
      SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&i_1);
      argument._4_4_ = argument._4_4_ + 1;
    }
    local_90 = SmallArray<CallArgumentData,_16U>::size(result);
    local_8c = local_90;
    for (; local_90 < uVar7; local_90 = local_90 + 1) {
      CallArgumentData::CallArgumentData
                ((CallArgumentData *)local_a0,(TypeBase *)0x0,(ExprBase *)0x0);
      SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)local_a0);
    }
    for (argument_1._4_4_ = local_8c; argument_1._4_4_ < (uint)arguments_local.data;
        argument_1._4_4_ = argument_1._4_4_ + 1) {
      _k = (ctx_local->uniqueDependencies).little + (ulong)argument_1._4_4_ * 6 + -6;
      if (_k[2] != (ModuleData *)0x0) {
        functionArgument._4_4_ = 0;
        for (functionArgument._0_4_ = 0; (uint)functionArgument < uVar7;
            functionArgument._0_4_ = (uint)functionArgument + 1) {
          local_c0 = arguments_local._8_8_ + (ulong)(uint)functionArgument * 0x30;
          if ((*(long *)(local_c0 + 0x10) != 0) &&
             (bVar6 = InplaceStr::operator==
                                ((InplaceStr *)(*(long *)(local_c0 + 0x10) + 0x40),
                                 (InplaceStr *)&_k[2]->importedFunctionCount), bVar6)) {
            pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,functionArgument._4_4_);
            if (pCVar11->type != (TypeBase *)0x0) {
              uVar1 = _k[2]->importedFunctionCount;
              uVar2._0_4_ = _k[2]->importedFunctionCount;
              uVar2._4_4_ = _k[2]->moduleFunctionCount;
              anon_unknown.dwarf_8df1c::Stop
                        ((ExpressionContext *)source_local,(SynBase *)(_k[4]->name).end,
                         "ERROR: argument \'%.*s\' is already set",
                         (ulong)(uint)((int)_k[2][1].source - uVar1),uVar2);
            }
            CallArgumentData::CallArgumentData
                      ((CallArgumentData *)auStack_d0,(TypeBase *)_k[3],(ExprBase *)_k[4]);
            pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,functionArgument._4_4_);
            pCVar11->type = _auStack_d0;
            pCVar11->value = local_c8;
            break;
          }
          functionArgument._4_4_ = functionArgument._4_4_ + 1;
        }
      }
    }
    for (argument_2._4_4_ = 0; argument_2._4_4_ < uVar7; argument_2._4_4_ = argument_2._4_4_ + 1) {
      value = (ExprBase *)(arguments_local._8_8_ + (ulong)argument_2._4_4_ * 0x30);
      pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,argument_2._4_4_);
      if ((pCVar11->type == (TypeBase *)0x0) &&
         (local_e8 = value->next, local_e8 != (ExprBase *)0x0)) {
        pTVar3 = local_e8->type;
        pEVar9 = ExpressionContext::get<ExprPassthrough>((ExpressionContext *)source_local);
        ExprPassthrough::ExprPassthrough(pEVar9,local_e8->source,local_e8->type,local_e8);
        CallArgumentData::CallArgumentData((CallArgumentData *)&i_5,pTVar3,&pEVar9->super_ExprBase);
        pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,argument_2._4_4_);
        pCVar11->type = _i_5;
        pCVar11->value = local_f0;
      }
    }
    for (argument_3._4_4_ = local_8c; argument_3._4_4_ < uVar7;
        argument_3._4_4_ = argument_3._4_4_ + 1) {
      pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,argument_3._4_4_);
      if (pCVar11->type == (TypeBase *)0x0) {
        return false;
      }
    }
  }
  else {
    for (argument_3._0_4_ = 0; (uint)argument_3 < (uint)arguments_local.data;
        argument_3._0_4_ = (uint)argument_3 + 1) {
      local_108 = (ctx_local->uniqueDependencies).little + (ulong)(uint)argument_3 * 6 + -6;
      CallArgumentData::CallArgumentData
                ((CallArgumentData *)local_118,(TypeBase *)local_108[3],(ExprBase *)local_108[4]);
      SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)local_118);
    }
    for (argument_4._4_4_ = result->count; argument_4._4_4_ < uVar7;
        argument_4._4_4_ = argument_4._4_4_ + 1) {
      value_1 = (ExprBase *)(arguments_local._8_8_ + (ulong)argument_4._4_4_ * 0x30);
      local_130 = value_1->next;
      if (local_130 != (ExprBase *)0x0) {
        pTVar3 = local_130->type;
        pEVar9 = ExpressionContext::get<ExprPassthrough>((ExpressionContext *)source_local);
        ExprPassthrough::ExprPassthrough(pEVar9,local_130->source,local_130->type,local_130);
        CallArgumentData::CallArgumentData
                  ((CallArgumentData *)&varArgType,pTVar3,&pEVar9->super_ExprBase);
        SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&varArgType);
      }
    }
    type = ExpressionContext::GetUnsizedArrayType
                     ((ExpressionContext *)source_local,(TypeBase *)source_local[0x228].pos.begin);
    bVar6 = ArrayView<ArgumentData>::empty((ArrayView<ArgumentData> *)&arguments_local.count);
    if (((!bVar6) &&
        (pAVar10 = ArrayView<ArgumentData>::back((ArrayView<ArgumentData> *)&arguments_local.count),
        (TypeUnsizedArray *)pAVar10->type == type)) &&
       (pAVar10 = ArrayView<ArgumentData>::back((ArrayView<ArgumentData> *)&arguments_local.count),
       (pAVar10->isExplicit & 1U) == 0)) {
      uVar7 = SmallArray<CallArgumentData,_16U>::size(result);
      uVar8 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count);
      if (uVar8 - 1 <= uVar7) {
        uVar7 = SmallArray<CallArgumentData,_16U>::size(result);
        uVar8 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count);
        if ((uVar7 != uVar8) ||
           (pCVar11 = SmallArray<CallArgumentData,_16U>::back(result),
           (TypeUnsizedArray *)pCVar11->type != type)) {
          if (extraRating != (uint *)0x0) {
            uVar7 = SmallArray<CallArgumentData,_16U>::size(result);
            uVar8 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count)
            ;
            *extraRating = ((uVar7 - uVar8) + -1) * 5 + 10;
          }
          values.tail = (ExprBase *)0x0;
          if ((local_41 & 1) != 0) {
            bVar6 = SmallArray<CallArgumentData,_16U>::empty(result);
            if (!bVar6) {
              pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,0);
              pSStack_40 = pCVar11->value->source;
            }
            IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_160);
            uVar7 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count)
            ;
            for (value_3._4_4_ = uVar7 - 1; uVar7 = value_3._4_4_,
                uVar8 = SmallArray<CallArgumentData,_16U>::size(result), uVar7 < uVar8;
                value_3._4_4_ = value_3._4_4_ + 1) {
              pCVar11 = SmallArray<CallArgumentData,_16U>::operator[](result,value_3._4_4_);
              arrType = (TypeArray *)pCVar11->value;
              local_178 = getType<TypeArray>((TypeBase *)(arrType->super_TypeBase).name.end);
              pSVar5 = source_local;
              pTVar13 = arrType;
              if (local_178 != (TypeArray *)0x0) {
                pSVar4 = (SynBase *)(arrType->super_TypeBase).name.begin;
                type_00 = ExpressionContext::GetUnsizedArrayType
                                    ((ExpressionContext *)source_local,local_178->subType);
                arrType = (TypeArray *)
                          CreateCast((ExpressionContext *)pSVar5,pSVar4,(ExprBase *)pTVar13,
                                     (TypeBase *)type_00,false);
              }
              pEVar12 = CreateCast((ExpressionContext *)source_local,
                                   (SynBase *)(arrType->super_TypeBase).name.begin,
                                   (ExprBase *)arrType,(TypeBase *)source_local[0x228].pos.begin,
                                   true);
              IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)auStack_160,pEVar12);
            }
            bVar6 = IntrusiveList<ExprBase>::empty((IntrusiveList<ExprBase> *)auStack_160);
            if (bVar6) {
              pEVar12 = &ExpressionContext::get<ExprNullptrLiteral>
                                   ((ExpressionContext *)source_local)->super_ExprBase;
              ExprNullptrLiteral::ExprNullptrLiteral
                        ((ExprNullptrLiteral *)pEVar12,pSStack_40,
                         *(TypeBase **)&source_local[0x228].typeID);
              values.tail = pEVar12;
            }
            else {
              this = ExpressionContext::get<ExprArray>((ExpressionContext *)source_local);
              pSVar4 = source_local;
              pSVar5 = pSStack_40;
              pTVar3 = (TypeBase *)source_local[0x228].pos.begin;
              uVar7 = IntrusiveList<ExprBase>::size((IntrusiveList<ExprBase> *)auStack_160);
              pTVar13 = ExpressionContext::GetArrayType
                                  ((ExpressionContext *)pSVar4,pTVar3,(ulong)uVar7);
              local_188 = _auStack_160;
              local_180 = values.head;
              values_00.tail = values.head;
              values_00.head = _auStack_160;
              ExprArray::ExprArray(this,pSVar5,&pTVar13->super_TypeBase,values_00);
              values.tail = &this->super_ExprBase;
            }
            values.tail = CreateCast((ExpressionContext *)source_local,pSStack_40,values.tail,
                                     (TypeBase *)type,true);
          }
          uVar7 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count);
          SmallArray<CallArgumentData,_16U>::shrink(result,uVar7 - 1);
          CallArgumentData::CallArgumentData
                    ((CallArgumentData *)local_198,(TypeBase *)type,values.tail);
          SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)local_198);
        }
      }
    }
  }
  uVar7 = SmallArray<CallArgumentData,_16U>::size(result);
  uVar8 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&arguments_local.count);
  if (uVar7 == uVar8) {
    if ((local_41 & 1) != 0) {
      for (argument_5._4_4_ = 0; argument_5._4_4_ < result->count;
          argument_5._4_4_ = argument_5._4_4_ + 1) {
        pCVar11 = result->data;
        if (pCVar11[argument_5._4_4_].value == (ExprBase *)0x0) {
          __assert_fail("argument.value",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1685,
                        "bool PrepareArgumentsForFunctionCall(ExpressionContext &, SynBase *, ArrayView<ArgumentData>, ArrayView<ArgumentData>, SmallArray<CallArgumentData, 16> &, unsigned int *, bool)"
                       );
        }
        pEVar12 = CreateCast((ExpressionContext *)source_local,
                             (pCVar11[argument_5._4_4_].value)->source,
                             pCVar11[argument_5._4_4_].value,
                             *(TypeBase **)
                              (arguments_local._8_8_ + (ulong)argument_5._4_4_ * 0x30 + 0x18),true);
        pCVar11[argument_5._4_4_].value = pEVar12;
      }
    }
    functionArguments_local._15_1_ = 1;
  }
  else {
    functionArguments_local._15_1_ = 0;
  }
  return (bool)functionArguments_local._15_1_;
}

Assistant:

bool PrepareArgumentsForFunctionCall(ExpressionContext &ctx, SynBase *source, ArrayView<ArgumentData> functionArguments, ArrayView<ArgumentData> arguments, SmallArray<CallArgumentData, 16> &result, unsigned *extraRating, bool prepareValues)
{
	result.clear();

	if(HasNamedCallArguments(arguments))
	{
		if(!HasMatchingArgumentNames(functionArguments, arguments))
			return false;

		// Add first unnamed arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				result.push_back(CallArgumentData(argument.type, argument.value));
			else
				break;
		}

		unsigned unnamedCount = result.size();

		// Reserve slots for all remaining arguments
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
			result.push_back(CallArgumentData(NULL, NULL));

		// Put named arguments in appropriate slots
		for(unsigned i = unnamedCount; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				continue;

			unsigned targetPos = 0;

			for(unsigned k = 0; k < functionArguments.count; k++)
			{
				ArgumentData &functionArgument = functionArguments.data[k];

				if(functionArgument.name && functionArgument.name->name == argument.name->name)
				{
					if(result[targetPos].type != NULL)
						Stop(ctx, argument.value->source, "ERROR: argument '%.*s' is already set", FMT_ISTR(argument.name->name));

					result[targetPos] = CallArgumentData(argument.type, argument.value);
					break;
				}

				targetPos++;
			}
		}

		// Fill in any unset arguments with default values
		for(unsigned i = 0; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(result[i].type == NULL)
			{
				if(ExprBase *value = argument.value)
					result[i] = CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value));
			}
		}

		// All arguments must be set
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
		{
			if(result[i].type == NULL)
				return false;
		}
	}
	else
	{
		// Add arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			result.push_back(CallArgumentData(argument.type, argument.value));
		}

		// Add any arguments with default values
		for(unsigned i = result.count; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(ExprBase *value = argument.value)
				result.push_back(CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value)));
		}

		// Create variadic pack if neccessary
		TypeBase *varArgType = ctx.GetUnsizedArrayType(ctx.typeAutoRef);

		if(!functionArguments.empty() && functionArguments.back().type == varArgType && !functionArguments.back().isExplicit)
		{
			if(result.size() >= functionArguments.size() - 1 && !(result.size() == functionArguments.size() && result.back().type == varArgType))
			{
				if(extraRating)
					*extraRating = 10 + (result.size() - functionArguments.size() - 1) * 5;

				ExprBase *value = NULL;

				if(prepareValues)
				{
					if(!result.empty())
						source = result[0].value->source;

					IntrusiveList<ExprBase> values;

					for(unsigned i = functionArguments.size() - 1; i < result.size(); i++)
					{
						ExprBase *value = result[i].value;

						if(TypeArray *arrType = getType<TypeArray>(value->type))
						{
							// type[N] is converted to type[] first
							value = CreateCast(ctx, value->source, value, ctx.GetUnsizedArrayType(arrType->subType), false);
						}

						values.push_back(CreateCast(ctx, value->source, value, ctx.typeAutoRef, true));
					}

					if(values.empty())
						value = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.typeNullPtr);
					else
						value = new (ctx.get<ExprArray>()) ExprArray(source, ctx.GetArrayType(ctx.typeAutoRef, values.size()), values);

					value = CreateCast(ctx, source, value, varArgType, true);
				}

				result.shrink(functionArguments.size() - 1);
				result.push_back(CallArgumentData(varArgType, value));
			}
		}
	}

	if(result.size() != functionArguments.size())
		return false;

	// Convert all arguments to target type if this is a real call
	if(prepareValues)
	{
		for(unsigned i = 0; i < result.count; i++)
		{
			CallArgumentData &argument = result.data[i];

			assert(argument.value);

			TypeBase *target = functionArguments.data[i].type;

			argument.value = CreateCast(ctx, argument.value->source, argument.value, target, true);
		}
	}

	return true;
}